

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O2

void __thiscall VulkanUtilities::VulkanInstance::VulkanInstance(VulkanInstance *this,CreateInfo *CI)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar1;
  uint32_t *Args;
  uint uVar2;
  pointer pVVar3;
  pointer ppcVar4;
  bool bVar5;
  VkResult VVar6;
  ostream *poVar7;
  VkInstance *ppVVar8;
  VkLayerProperties *Layer;
  pointer pVVar9;
  long lVar10;
  uint32_t ext;
  uint uVar11;
  ulong uVar12;
  char *in_R8;
  pointer ppcVar13;
  DebugMode DVar14;
  VulkanInstance *pVVar15;
  uint32_t LayerVer;
  undefined1 local_29c;
  undefined1 local_29b;
  undefined1 local_29a;
  undefined1 local_299;
  CreateInfo *local_298;
  VulkanUtilities *local_290;
  char *LayerName;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceExtensions;
  uint32_t LayerCount;
  uint uStack_244;
  pointer pVStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  char *local_228;
  char local_220 [4];
  uint local_21c;
  vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_> *local_210;
  vector<VkLayerProperties,_std::allocator<VkLayerProperties>_> *local_208;
  uint local_200;
  char local_1fc [12];
  uint local_1f0;
  uint local_1ec;
  vector<const_char_*,_std::allocator<const_char_*>_> InstanceLayers;
  string msg;
  
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<VulkanUtilities::VulkanInstance>)._M_weak_this.
  super___weak_ptr<VulkanUtilities::VulkanInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_DebugMode = Disabled;
  this->m_pVkAllocator = CI->pVkAllocator;
  this->m_VkInstance = (VkInstance)0x0;
  this->m_VkVersion = 0x400000;
  local_208 = &this->m_Layers;
  local_290 = (VulkanUtilities *)&this->m_Extensions;
  pvVar1 = &this->m_EnabledExtensions;
  local_210 = &this->m_PhysicalDevices;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_EnabledExtensions).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_PhysicalDevices).
  super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298 = CI;
  VVar6 = volkInitialize();
  if (VVar6 != VK_SUCCESS) {
    in_R8 = "Failed to load Vulkan.";
    Diligent::LogError<true,char[23]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x103,(char (*) [23])"Failed to load Vulkan.");
  }
  _LayerCount = (pointer)((ulong)uStack_244 << 0x20);
  VVar6 = (*vkEnumerateInstanceLayerProperties)(&LayerCount,(VkLayerProperties *)0x0);
  if (VVar6 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VkResultToString(VVar6);
    in_R8 = "Failed to query layer count";
    Diligent::LogError<true,char[28],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10c,(char (*) [28])"Failed to query layer count",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  std::vector<VkLayerProperties,_std::allocator<VkLayerProperties>_>::resize
            (local_208,(ulong)_LayerCount & 0xffffffff);
  (*vkEnumerateInstanceLayerProperties)
            (&LayerCount,
             (local_208->super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>).
             _M_impl.super__Vector_impl_data._M_start);
  if (VVar6 != VK_SUCCESS) {
    msg._M_dataplus._M_p = VkResultToString(VVar6);
    in_R8 = "Failed to enumerate extensions";
    Diligent::LogError<true,char[31],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x10f,(char (*) [31])"Failed to enumerate extensions",
               (char (*) [17])"\nVK Error Code: ",(char **)&msg);
  }
  if ((char (*) [30])
      (((long)(this->m_Layers).
              super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(this->m_Layers).
             super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x208) !=
      (char (*) [30])((ulong)_LayerCount & 0xffffffff)) {
    Diligent::FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LayerCount == m_Layers.size()",
               (char (*) [30])((ulong)_LayerCount & 0xffffffff));
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x110);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (local_298->LogExtensions == true) {
    if ((this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->m_Layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[32]>(&msg,(char (*) [32])"No Vulkan instance layers found");
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    else {
      pVVar15 = this;
      std::__cxx11::stringstream::stringstream((stringstream *)&msg);
      pVVar3 = (pVVar15->m_Layers).
               super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar9 = (pVVar15->m_Layers).
                    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>.
                    _M_impl.super__Vector_impl_data._M_start; pVVar9 != pVVar3; pVVar9 = pVVar9 + 1)
      {
        poVar7 = std::operator<<((ostream *)msg.field_2._M_local_buf,"\n    ");
        poVar7 = std::operator<<(poVar7,pVVar9->layerName);
        poVar7 = std::operator<<(poVar7,' ');
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,'.');
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        poVar7 = std::operator<<(poVar7,'.');
        std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      }
      std::__cxx11::stringbuf::str();
      Diligent::FormatString<char[35],std::__cxx11::string>
                ((string *)&LayerCount,(Diligent *)"Available Vulkan instance layers: ",
                 (char (*) [35])&LayerName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::__cxx11::string::~string((string *)&LayerName);
      this = pVVar15;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,_LayerCount,0,0);
        this = pVVar15;
      }
      std::__cxx11::string::~string((string *)&LayerCount);
      std::__cxx11::stringstream::~stringstream((stringstream *)&msg);
    }
  }
  bVar5 = anon_unknown_1::EnumerateInstanceExtensions
                    ((char *)0x0,
                     (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     local_290);
  if (!bVar5) {
    in_R8 = "Failed to enumerate instance extensions";
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x12a,(char (*) [40])"Failed to enumerate instance extensions");
  }
  pVVar15 = this;
  if (local_298->LogExtensions == true) {
    if ((this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->m_Extensions).
        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Diligent::FormatString<char[36]>(&msg,(char (*) [36])"No Vulkan instance extensions found");
      pVVar15 = this;
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
        pVVar15 = this;
      }
    }
    else {
      PrintExtensionsList_abi_cxx11_
                ((string *)&LayerCount,local_290,
                 (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x1,
                 (size_t)this);
      Diligent::FormatString<char[39],std::__cxx11::string>
                (&msg,(Diligent *)"Supported Vulkan instance extensions: ",
                 (char (*) [39])&LayerCount,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      std::__cxx11::string::~string((string *)&LayerCount);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0);
      }
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar5 = anon_unknown_1::IsExtensionAvailable
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     local_290,"VK_KHR_surface");
  if (bVar5) {
    msg._M_dataplus._M_p = "VK_KHR_surface";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,(char **)&msg)
    ;
    msg._M_dataplus._M_p = "VK_KHR_xlib_surface";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,(char **)&msg)
    ;
    msg._M_dataplus._M_p = "VK_KHR_xcb_surface";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,(char **)&msg)
    ;
  }
  bVar5 = anon_unknown_1::IsExtensionAvailable
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     local_290,"VK_KHR_get_physical_device_properties2");
  if (bVar5) {
    msg._M_dataplus._M_p = "VK_KHR_get_physical_device_properties2";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,(char **)&msg)
    ;
  }
  ppcVar4 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVVar8 = &pVVar15->m_VkInstance;
  for (ppcVar13 = InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppcVar13 != ppcVar4;
      ppcVar13 = ppcVar13 + 1) {
    msg._M_dataplus._M_p = *ppcVar13;
    bVar5 = anon_unknown_1::IsExtensionAvailable
                      ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                       local_290,msg._M_dataplus._M_p);
    if (!bVar5) {
      in_R8 = "Required extension ";
      Diligent::LogError<true,char[20],char_const*,char[18]>
                (false,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x162,(char (*) [20])"Required extension ",(char **)&msg,
                 (char (*) [18])" is not available");
    }
  }
  Args = &local_298->ExtensionCount;
  if (local_298->ppExtensionNames == (char **)0x0) {
    if (*Args != 0) {
      Diligent::FormatString<char[61],unsigned_int,char[84]>
                (&msg,(Diligent *)"Global extensions pointer is null while extensions count is ",
                 (char (*) [61])Args,
                 (uint *)
                 ". Please initialize \'ppInstanceExtensionNames\' member of EngineVkCreateInfo struct."
                 ,(char (*) [84])in_R8);
      Diligent::DebugAssertionFailed
                (msg._M_dataplus._M_p,"VulkanInstance",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
                 ,0x176);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  else {
    for (uVar12 = 0; uVar12 < *Args; uVar12 = uVar12 + 1) {
      _LayerCount = local_298->ppExtensionNames[uVar12];
      if (_LayerCount != (char *)0x0) {
        bVar5 = anon_unknown_1::IsExtensionAvailable
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           local_290,_LayerCount);
        if (bVar5) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&InstanceExtensions,(value_type *)&LayerCount);
        }
        else {
          Diligent::FormatString<char[11],char_const*,char[18]>
                    (&msg,(Diligent *)"Extension ",(char (*) [11])&LayerCount,
                     (char **)" is not available",(char (*) [18])in_R8);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
        }
      }
    }
  }
  uVar2 = local_298->ApiVersion;
  uVar11 = 0x400000;
  if (0x400000 < uVar2 && vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) {
    msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffff00000000;
    (*vkEnumerateInstanceVersion)((uint32_t *)&msg);
    uVar11 = uVar2;
    if ((uint)msg._M_dataplus._M_p < uVar2) {
      uVar11 = (uint)msg._M_dataplus._M_p;
    }
  }
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((local_298->EnableDeviceSimulation == true) &&
     (bVar5 = IsLayerAvailable(pVVar15,VulkanInstance::DeviceSimulationLayer,(uint32_t *)&msg),
     bVar5)) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              (&InstanceLayers,&VulkanInstance::DeviceSimulationLayer);
  }
  local_200 = uVar11;
  if (local_298->EnableValidation == true) {
    bVar5 = anon_unknown_1::IsExtensionAvailable
                      ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                       local_290,"VK_EXT_debug_utils");
    if (bVar5) {
      DVar14 = Utils;
LAB_0025c81d:
      pVVar15->m_DebugMode = DVar14;
    }
    else {
      bVar5 = anon_unknown_1::IsExtensionAvailable
                        ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                         local_290,"VK_EXT_debug_report");
      if (bVar5) {
        DVar14 = Report;
        goto LAB_0025c81d;
      }
    }
    for (lVar10 = 8; lVar10 != 0; lVar10 = lVar10 + -8) {
      LayerName = "VK_LAYER_KHRONOS_validation";
      LayerVer = 0xffffffff;
      bVar5 = IsLayerAvailable(pVVar15,"VK_LAYER_KHRONOS_validation",&LayerVer);
      if (bVar5) {
        if (LayerVer < 0x404135) {
          LayerCount = LayerVer >> 0x16;
          local_299 = 0x2e;
          local_1ec = LayerVer >> 0xc & 0x3ff;
          local_29a = 0x2e;
          local_1f0 = LayerVer & 0xfff;
          local_1fc[8] = '\x01';
          local_1fc[9] = '\0';
          local_1fc[10] = '\0';
          local_1fc[0xb] = '\0';
          local_29b = 0x2e;
          local_1fc[4] = '\x04';
          local_1fc[5] = '\0';
          local_1fc[6] = '\0';
          local_1fc[7] = '\0';
          local_29c = 0x2e;
          local_1fc[0] = '5';
          local_1fc[1] = '\x01';
          local_1fc[2] = '\0';
          local_1fc[3] = '\0';
          in_R8 = (char *)&LayerCount;
          Diligent::
          FormatString<char[8],char_const*,char[12],unsigned_int,char,unsigned_int,char,unsigned_int,char[36],unsigned_int,char,unsigned_int,char,unsigned_int,char[3]>
                    (&msg,(Diligent *)"Layer \'",(char (*) [8])&LayerName,(char **)"\' version (",
                     (char (*) [12])in_R8,(uint *)&local_299,(char *)&local_1ec,(uint *)&local_29a,
                     (char *)&local_1f0,(uint *)") is less than the header version (",
                     (char (*) [36])(local_1fc + 8),(uint *)&local_29b,local_1fc + 4,
                     (uint *)&local_29c,local_1fc,(uint *)0x8019c0,(char (*) [3])pVVar15);
          if (Diligent::DebugMessageCallback != (undefined *)0x0) {
            in_R8 = (char *)0x0;
            (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
          }
          std::__cxx11::string::~string((string *)&msg);
        }
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (&InstanceLayers,(value_type *)&LayerName);
        if (pVVar15->m_DebugMode != Utils) {
          _LayerCount = (char *)0x0;
          pVStack_240 = (pointer)0x0;
          local_238._M_allocated_capacity = 0;
          bVar5 = anon_unknown_1::EnumerateInstanceExtensions
                            (LayerName,
                             (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              *)&LayerCount);
          if (bVar5) {
            bVar5 = anon_unknown_1::IsExtensionAvailable
                              ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                *)&LayerCount,"VK_EXT_debug_utils");
            if (bVar5) {
              pVVar15->m_DebugMode = Utils;
            }
            else if ((pVVar15->m_DebugMode == Disabled) &&
                    (bVar5 = anon_unknown_1::IsExtensionAvailable
                                       ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                                         *)&LayerCount,"VK_EXT_debug_report"), bVar5)) {
              pVVar15->m_DebugMode = Report;
            }
          }
          else {
            Diligent::FormatString<char[36],char_const*,char[7]>
                      (&msg,(Diligent *)"Failed to enumerate extensions for ",
                       (char (*) [36])&LayerName,(char **)" layer",(char (*) [7])in_R8);
            if (Diligent::DebugMessageCallback != (undefined *)0x0) {
              in_R8 = (char *)0x0;
              (*(code *)Diligent::DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0);
            }
            std::__cxx11::string::~string((string *)&msg);
          }
          std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::
          ~_Vector_base((_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                         *)&LayerCount);
        }
      }
      else {
        Diligent::FormatString<char[18],char_const*,char[19]>
                  (&msg,(Diligent *)"Validation layer ",(char (*) [18])&LayerName,
                   (char **)" is not available.",(char (*) [19])in_R8);
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    if (pVVar15->m_DebugMode == Utils) {
      msg._M_dataplus._M_p = "VK_EXT_debug_utils";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (char **)&msg);
    }
    else if (pVVar15->m_DebugMode == Report) {
      msg._M_dataplus._M_p = "VK_EXT_debug_report";
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&InstanceExtensions,
                 (char **)&msg);
    }
    else {
      in_R8 = "VK_EXT_debug_report";
      Diligent::FormatString<char[9],char[19],char[6],char[20],char[117]>
                (&msg,(Diligent *)"Neither ",(char (*) [9])"VK_EXT_debug_utils",
                 (char (*) [19])" nor ",(char (*) [6])"VK_EXT_debug_report",
                 (char (*) [20])
                 " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled."
                 ,(char (*) [117])pVVar15);
      if (Diligent::DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if (local_298->ppEnabledLayerNames != (char **)0x0) {
    for (uVar12 = 0; uVar12 < local_298->EnabledLayerCount; uVar12 = uVar12 + 1) {
      _LayerCount = local_298->ppEnabledLayerNames[uVar12];
      if (_LayerCount == (char *)0x0) goto LAB_0025cf89;
      bVar5 = IsLayerAvailable(pVVar15,_LayerCount,(uint32_t *)&LayerName);
      if (bVar5) {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (&InstanceLayers,(value_type *)&LayerCount);
      }
      else {
        Diligent::FormatString<char[16],char_const*,char[18]>
                  (&msg,(Diligent *)"Instance layer ",(char (*) [16])&LayerCount,
                   (char **)" is not available",(char (*) [18])in_R8);
        if (Diligent::DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)Diligent::DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
  uVar2 = local_200;
  local_238._M_allocated_capacity = 0;
  local_238._8_8_ = 0;
  _LayerCount = (char *)0x0;
  pVStack_240 = (pointer)0x0;
  local_228 = "Diligent Engine";
  local_220[0] = '\b';
  local_220[1] = -0x18;
  local_220[2] = '\x03';
  local_220[3] = '\0';
  msg._M_string_length = 0;
  msg._M_dataplus._M_p = (pointer)0x1;
  msg.field_2._M_allocated_capacity = 0;
  local_21c = local_200;
  msg.field_2._8_8_ = &LayerCount;
  VVar6 = (*vkCreateInstance)((VkInstanceCreateInfo *)&msg,pVVar15->m_pVkAllocator,ppVVar8);
  if (VVar6 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar6);
    Diligent::LogError<true,char[33],char[17],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x221,(char (*) [33])"Failed to create Vulkan instance",
               (char (*) [17])"\nVK Error Code: ",&LayerName);
  }
  volkLoadInstance(*ppVVar8);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::_M_move_assign
            (pvVar1,&InstanceExtensions);
  pVVar15->m_VkVersion = uVar2;
  if (pVVar15->m_DebugMode == Report) {
    bVar5 = SetupDebugReport(*ppVVar8,VK_DEBUG_REPORT_ERROR_BIT_EXT|
                                      VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT|
                                      VK_DEBUG_REPORT_WARNING_BIT_EXT,(void *)0x0);
    if (bVar5) goto LAB_0025cdcb;
    Diligent::FormatString<char[86]>
              ((string *)&LayerName,
               (char (*) [86])
               "Failed to initialize debug report. Validation layer message logging will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  else {
    if ((pVVar15->m_DebugMode != Utils) ||
       (bVar5 = SetupDebugUtils(*ppVVar8,0x1100,7,local_298->IgnoreDebugMessageCount,
                                local_298->ppIgnoreDebugMessageNames,(void *)0x0), bVar5))
    goto LAB_0025cdcb;
    Diligent::FormatString<char[112]>
              ((string *)&LayerName,
               (char (*) [112])
               "Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled."
              );
    if (Diligent::DebugMessageCallback != (undefined *)0x0) {
      (*(code *)Diligent::DebugMessageCallback)(2,LayerName,0,0,0);
    }
  }
  std::__cxx11::string::~string((string *)&LayerName);
LAB_0025cdcb:
  LayerVer = 0;
  VVar6 = (*vkEnumeratePhysicalDevices)(*ppVVar8,&LayerVer,(VkPhysicalDevice *)0x0);
  if (VVar6 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar6);
    Diligent::LogError<false,char[36],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247,(char (*) [36])"Failed to get physical device count",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x731c01);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x247);
    std::__cxx11::string::~string((string *)&LayerName);
  }
  if (LayerVer == 0) {
    Diligent::LogError<true,char[40]>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x249,(char (*) [40])"No physical devices found on the system");
  }
  std::vector<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>::resize
            (local_210,(ulong)LayerVer);
  VVar6 = (*vkEnumeratePhysicalDevices)
                    (*ppVVar8,&LayerVer,
                     (local_210->
                     super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  if (VVar6 != VK_SUCCESS) {
    LayerName = VkResultToString(VVar6);
    Diligent::LogError<false,char[37],char[12],char_const*>
              (false,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e,(char (*) [37])"Failed to enumerate physical devices",
               (char (*) [12])"\nVK Error: ",&LayerName);
    Diligent::FormatString<char[6]>((string *)&LayerName,(char (*) [6])0x731c01);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24e);
    std::__cxx11::string::~string((string *)&LayerName);
  }
  if ((char (*) [48])
      ((long)(pVVar15->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)(pVVar15->m_PhysicalDevices).
             super__Vector_base<VkPhysicalDevice_T_*,_std::allocator<VkPhysicalDevice_T_*>_>._M_impl
             .super__Vector_impl_data._M_start >> 3) != (char (*) [48])(ulong)LayerVer) {
    Diligent::FormatString<char[26],char[48]>
              ((string *)&LayerName,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_PhysicalDevices.size() == PhysicalDeviceCount",
               (char (*) [48])(ulong)LayerVer);
    Diligent::DebugAssertionFailed
              (LayerName,"VulkanInstance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x24f);
    std::__cxx11::string::~string((string *)&LayerName);
  }
  Diligent::GLSLangUtils::InitializeGlslang();
LAB_0025cf89:
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&InstanceLayers.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&InstanceExtensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

VulkanInstance::VulkanInstance(const CreateInfo& CI) :
    m_pVkAllocator{CI.pVkAllocator}
{
#if DILIGENT_USE_VOLK
    if (volkInitialize() != VK_SUCCESS)
    {
        LOG_ERROR_AND_THROW("Failed to load Vulkan.");
    }
#endif

    {
        // Enumerate available layers
        uint32_t LayerCount = 0;

        auto res = vkEnumerateInstanceLayerProperties(&LayerCount, nullptr);
        CHECK_VK_ERROR_AND_THROW(res, "Failed to query layer count");
        m_Layers.resize(LayerCount);
        vkEnumerateInstanceLayerProperties(&LayerCount, m_Layers.data());
        CHECK_VK_ERROR_AND_THROW(res, "Failed to enumerate extensions");
        VERIFY_EXPR(LayerCount == m_Layers.size());
    }

    if (CI.LogExtensions)
    {
        if (!m_Layers.empty())
        {
            std::stringstream ss;
            for (const auto& Layer : m_Layers)
            {
                ss << "\n    "
                   << Layer.layerName << ' '
                   << VK_API_VERSION_MAJOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_MINOR(Layer.specVersion) << '.'
                   << VK_API_VERSION_PATCH(Layer.specVersion);
            }
            LOG_INFO_MESSAGE("Available Vulkan instance layers: ", ss.str());
        }
        else
        {
            LOG_INFO_MESSAGE("No Vulkan instance layers found");
        }
    }

    // Enumerate available instance extensions
    if (!EnumerateInstanceExtensions(nullptr, m_Extensions))
        LOG_ERROR_AND_THROW("Failed to enumerate instance extensions");

    if (CI.LogExtensions)
    {
        if (!m_Extensions.empty())
            LOG_INFO_MESSAGE("Supported Vulkan instance extensions: ", PrintExtensionsList(m_Extensions, 1));
        else
            LOG_INFO_MESSAGE("No Vulkan instance extensions found");
    }

    std::vector<const char*> InstanceExtensions;
    if (IsExtensionAvailable(VK_KHR_SURFACE_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_SURFACE_EXTENSION_NAME);

        // Enable surface extensions depending on OS
#if defined(VK_USE_PLATFORM_WIN32_KHR)
        InstanceExtensions.push_back(VK_KHR_WIN32_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_ANDROID_KHR)
        InstanceExtensions.push_back(VK_KHR_ANDROID_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_WAYLAND_KHR)
        InstanceExtensions.push_back(VK_KHR_WAYLAND_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XLIB_KHR)
        InstanceExtensions.push_back(VK_KHR_XLIB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_XCB_KHR)
        InstanceExtensions.push_back(VK_KHR_XCB_SURFACE_EXTENSION_NAME);
#endif
#if defined(VK_USE_PLATFORM_METAL_EXT)
        InstanceExtensions.push_back(VK_EXT_METAL_SURFACE_EXTENSION_NAME);
#endif
    };

#if PLATFORM_MACOS
    // Beginning with the 1.3.216 Vulkan SDK, the Vulkan Loader is strictly
    // enforcing the new VK_KHR_PORTABILITY_subset extension.
    constexpr bool UsePortabilityEnumeartion = true;
#else
    constexpr bool UsePortabilityEnumeartion = false;
#endif

    if (UsePortabilityEnumeartion)
        InstanceExtensions.push_back(VK_KHR_PORTABILITY_ENUMERATION_EXTENSION_NAME);

    // This extension added to core in 1.1, but current version is 1.0
    if (IsExtensionAvailable(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME))
    {
        InstanceExtensions.push_back(VK_KHR_GET_PHYSICAL_DEVICE_PROPERTIES_2_EXTENSION_NAME);
    }

    for (const auto* ExtName : InstanceExtensions)
    {
        if (!IsExtensionAvailable(ExtName))
            LOG_ERROR_AND_THROW("Required extension ", ExtName, " is not available");
    }

    if (CI.ppExtensionNames != nullptr)
    {
        for (uint32_t ext = 0; ext < CI.ExtensionCount; ++ext)
        {
            const auto* ExtName = CI.ppExtensionNames[ext];
            if (ExtName == nullptr)
                continue;
            if (IsExtensionAvailable(ExtName))
                InstanceExtensions.push_back(ExtName);
            else
                LOG_WARNING_MESSAGE("Extension ", ExtName, " is not available");
        }
    }
    else
    {
        DEV_CHECK_ERR(CI.ExtensionCount == 0,
                      "Global extensions pointer is null while extensions count is ", CI.ExtensionCount,
                      ". Please initialize 'ppInstanceExtensionNames' member of EngineVkCreateInfo struct.");
    }

    uint32_t ApiVersion = CI.ApiVersion;
#if DILIGENT_USE_VOLK
    if (vkEnumerateInstanceVersion != nullptr && ApiVersion > VK_API_VERSION_1_0)
    {
        uint32_t MaxApiVersion = 0;
        vkEnumerateInstanceVersion(&MaxApiVersion);
        ApiVersion = std::min(ApiVersion, MaxApiVersion);
    }
    else
    {
        // Only Vulkan 1.0 is supported.
        ApiVersion = VK_API_VERSION_1_0;
    }
#else
    // Without Volk we can only use Vulkan 1.0
    ApiVersion = VK_API_VERSION_1_0;
#endif

#if DILIGENT_USE_OPENXR
    XrInstance                xrInstance            = XR_NULL_HANDLE;
    XrSystemId                xrSystemId            = XR_NULL_SYSTEM_ID;
    PFN_xrGetInstanceProcAddr xrGetInstanceProcAddr = nullptr;
    if (CI.XR.Instance != 0)
    {
        if (CI.XR.GetInstanceProcAddr == nullptr)
            LOG_ERROR_AND_THROW("xrGetInstanceProcAddr must not be null");

        static_assert(sizeof(XrInstance) == sizeof(CI.XR.Instance), "XrInstance size mismatch");
        memcpy(&xrInstance, &CI.XR.Instance, sizeof(XrInstance));
        static_assert(sizeof(XrSystemId) == sizeof(CI.XR.SystemId), "XrSystemId size mismatch");
        memcpy(&xrSystemId, &CI.XR.SystemId, sizeof(XrSystemId));
        xrGetInstanceProcAddr = reinterpret_cast<PFN_xrGetInstanceProcAddr>(CI.XR.GetInstanceProcAddr);
    }
    if (xrInstance != 0)
    {
        ApiVersion = GetRequiredOpenXRVulkanVersion(ApiVersion, xrInstance, xrSystemId, xrGetInstanceProcAddr);
    }
#endif

    std::vector<const char*> InstanceLayers;

    // Use VK_DEVSIM_FILENAME environment variable to define the simulation layer
    if (CI.EnableDeviceSimulation)
    {
        static const char* DeviceSimulationLayer = "VK_LAYER_LUNARG_device_simulation";

        uint32_t LayerVer = 0;
        if (IsLayerAvailable(DeviceSimulationLayer, LayerVer))
        {
            InstanceLayers.push_back(DeviceSimulationLayer);
        }
    }

    if (CI.EnableValidation)
    {
        if (IsExtensionAvailable(VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
        {
            // Prefer VK_EXT_debug_utils
            m_DebugMode = DebugMode::Utils;
        }
        else if (IsExtensionAvailable(VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
        {
            // If debug utils are unavailable (e.g. on Android), use VK_EXT_debug_report
            m_DebugMode = DebugMode::Report;
        }

        for (const auto* LayerName : ValidationLayerNames)
        {
            uint32_t LayerVer = ~0u;
            if (!IsLayerAvailable(LayerName, LayerVer))
            {
                LOG_WARNING_MESSAGE("Validation layer ", LayerName, " is not available.");
                continue;
            }

            // Beta extensions may vary and result in a crash.
            // New enums are not supported and may cause validation error.
            if (LayerVer < VK_HEADER_VERSION_COMPLETE)
            {
                LOG_WARNING_MESSAGE("Layer '", LayerName, "' version (", VK_API_VERSION_MAJOR(LayerVer), '.', VK_API_VERSION_MINOR(LayerVer), '.', VK_API_VERSION_PATCH(LayerVer),
                                    ") is less than the header version (",
                                    VK_API_VERSION_MAJOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_MINOR(VK_HEADER_VERSION_COMPLETE), '.', VK_API_VERSION_PATCH(VK_HEADER_VERSION_COMPLETE),
                                    ").");
            }

            InstanceLayers.push_back(LayerName);

            if (m_DebugMode != DebugMode::Utils)
            {
                // On Android, VK_EXT_debug_utils extension may not be supported by the loader,
                // but supported by the layer.
                std::vector<VkExtensionProperties> LayerExtensions;
                if (EnumerateInstanceExtensions(LayerName, LayerExtensions))
                {
                    if (VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_UTILS_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Utils;

                    if (m_DebugMode == DebugMode::Disabled && VulkanUtilities::IsExtensionAvailable(LayerExtensions, VK_EXT_DEBUG_REPORT_EXTENSION_NAME))
                        m_DebugMode = DebugMode::Report; // Resort to debug report
                }
                else
                {
                    LOG_ERROR_MESSAGE("Failed to enumerate extensions for ", LayerName, " layer");
                }
            }
        }


        if (m_DebugMode == DebugMode::Utils)
            InstanceExtensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);
        else if (m_DebugMode == DebugMode::Report)
            InstanceExtensions.push_back(VK_EXT_DEBUG_REPORT_EXTENSION_NAME);
        else
            LOG_WARNING_MESSAGE("Neither ", VK_EXT_DEBUG_UTILS_EXTENSION_NAME, " nor ", VK_EXT_DEBUG_REPORT_EXTENSION_NAME, " extension is available. Debug tools (validation layer message logging, performance markers, etc.) will be disabled.");
    }

    if (CI.ppEnabledLayerNames != nullptr)
    {
        for (size_t i = 0; i < CI.EnabledLayerCount; ++i)
        {
            const auto* LayerName = CI.ppEnabledLayerNames[i];
            if (LayerName == nullptr)
                return;
            uint32_t LayerVer = 0;
            if (IsLayerAvailable(LayerName, LayerVer))
                InstanceLayers.push_back(LayerName);
            else
                LOG_WARNING_MESSAGE("Instance layer ", LayerName, " is not available");
        }
    }

    VkApplicationInfo appInfo{};
    appInfo.sType              = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    appInfo.pNext              = nullptr; // Pointer to an extension-specific structure.
    appInfo.pApplicationName   = nullptr;
    appInfo.applicationVersion = 0; // Developer-supplied version number of the application
    appInfo.pEngineName        = "Diligent Engine";
    appInfo.engineVersion      = DILIGENT_API_VERSION; // Developer-supplied version number of the engine used to create the application.
    appInfo.apiVersion         = ApiVersion;

    VkInstanceCreateInfo InstanceCreateInfo{};
    InstanceCreateInfo.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    InstanceCreateInfo.pNext = nullptr; // Pointer to an extension-specific structure.
    InstanceCreateInfo.flags = 0;
    if (UsePortabilityEnumeartion)
    {
        // The instance will enumerate available Vulkan Portability-compliant physical
        // devices and groups in addition to the Vulkan physical devices and groups that
        // are enumerated by default.
        InstanceCreateInfo.flags |= VK_INSTANCE_CREATE_ENUMERATE_PORTABILITY_BIT_KHR;
    }
    InstanceCreateInfo.pApplicationInfo        = &appInfo;
    InstanceCreateInfo.enabledExtensionCount   = static_cast<uint32_t>(InstanceExtensions.size());
    InstanceCreateInfo.ppEnabledExtensionNames = InstanceExtensions.empty() ? nullptr : InstanceExtensions.data();
    InstanceCreateInfo.enabledLayerCount       = static_cast<uint32_t>(InstanceLayers.size());
    InstanceCreateInfo.ppEnabledLayerNames     = InstanceLayers.empty() ? nullptr : InstanceLayers.data();

    VkResult res = VK_ERROR_UNKNOWN;
#if DILIGENT_USE_OPENXR
    if (xrInstance != XR_NULL_HANDLE)
    {
        res = CreateVkInstanceForOpenXR(xrInstance, xrSystemId, xrGetInstanceProcAddr, &InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    else
#endif
    {
        res = vkCreateInstance(&InstanceCreateInfo, m_pVkAllocator, &m_VkInstance);
    }
    CHECK_VK_ERROR_AND_THROW(res, "Failed to create Vulkan instance");

#if DILIGENT_USE_VOLK
    volkLoadInstance(m_VkInstance);
#endif

    m_EnabledExtensions = std::move(InstanceExtensions);
    m_VkVersion         = ApiVersion;

    // If requested, we enable the default validation layers for debugging
    if (m_DebugMode == DebugMode::Utils)
    {
        constexpr VkDebugUtilsMessageSeverityFlagsEXT messageSeverity =
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT;
        constexpr VkDebugUtilsMessageTypeFlagsEXT messageType =
            VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
            VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
        if (!VulkanUtilities::SetupDebugUtils(m_VkInstance, messageSeverity, messageType, CI.IgnoreDebugMessageCount, CI.ppIgnoreDebugMessageNames, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug utils. Validation layer message logging, performance markers, etc. will be disabled.");
    }
    else if (m_DebugMode == DebugMode::Report)
    {
        constexpr VkDebugReportFlagBitsEXT flags = static_cast<VkDebugReportFlagBitsEXT>(
            VK_DEBUG_REPORT_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT |
            VK_DEBUG_REPORT_ERROR_BIT_EXT);
        if (!VulkanUtilities::SetupDebugReport(m_VkInstance, flags, nullptr))
            LOG_ERROR_MESSAGE("Failed to initialize debug report. Validation layer message logging will be disabled.");
    }

    // Enumerate physical devices
    {
        // Physical device
        uint32_t PhysicalDeviceCount = 0;
        // Get the number of available physical devices
        auto err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, nullptr);
        CHECK_VK_ERROR(err, "Failed to get physical device count");
        if (PhysicalDeviceCount == 0)
            LOG_ERROR_AND_THROW("No physical devices found on the system");

        // Enumerate devices
        m_PhysicalDevices.resize(PhysicalDeviceCount);
        err = vkEnumeratePhysicalDevices(m_VkInstance, &PhysicalDeviceCount, m_PhysicalDevices.data());
        CHECK_VK_ERROR(err, "Failed to enumerate physical devices");
        VERIFY_EXPR(m_PhysicalDevices.size() == PhysicalDeviceCount);
    }
#if !DILIGENT_NO_GLSLANG
    Diligent::GLSLangUtils::InitializeGlslang();
#endif
}